

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# numfmt.cpp
# Opt level: O2

void icu_63::initNumberFormatService(void)

{
  ICULocaleService *this;
  code *size;
  
  size = numfmt_cleanup;
  ucln_i18n_registerCleanup_63(UCLN_I18N_NUMFMT,numfmt_cleanup);
  this = (ICULocaleService *)UMemory::operator_new((UMemory *)0x198,(size_t)size);
  if (this != (ICULocaleService *)0x0) {
    ICUNumberFormatService::ICUNumberFormatService((ICUNumberFormatService *)this);
  }
  gService = this;
  return;
}

Assistant:

static void U_CALLCONV initNumberFormatService() {
    U_ASSERT(gService == NULL);
    ucln_i18n_registerCleanup(UCLN_I18N_NUMFMT, numfmt_cleanup);
    gService = new ICUNumberFormatService();
}